

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O3

uint8_t __thiscall Cache::getByteCopy(Cache *this,uint32_t addr,uint32_t *cycles)

{
  uint32_t *puVar1;
  uint uVar2;
  sbyte sVar3;
  byte extraout_AL;
  uint32_t uVar4;
  Cache *pCVar5;
  uint32_t *cycles_00;
  Block *b;
  Cache *this_00;
  ulong uVar6;
  ulong uVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  
  b = (Block *)(ulong)addr;
  uVar4 = getBlockId(this,addr);
  __x = extraout_XMM0_Qa;
  if (uVar4 == 0xffffffff) {
    loadBlockFromLowerLevel(this,addr,cycles);
    this_00 = this;
    uVar4 = getBlockId(this,addr);
    __x = extraout_XMM0_Qa_00;
    if (uVar4 == 0xffffffff) {
      getByteCopy();
      uVar4 = getAddr(this_00,b);
      pCVar5 = this_00->lower_cache;
      if (pCVar5 == (Cache *)0x0) {
        puVar1 = &(this_00->statistics).cycle_cnt;
        *puVar1 = *puVar1 + 100;
        if (cycles_00 != (uint32_t *)0x0) {
          *cycles_00 = *cycles_00 + 100;
        }
        uVar7 = 0;
        if (b->size != 0) {
          uVar6 = 0;
          do {
            MemoryManager::setByteNoCache
                      (this_00->memory,uVar4 + (int)uVar6,
                       (b->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar6]);
            uVar7 = (ulong)b->size;
            uVar6 = uVar6 + 1;
          } while (uVar6 < uVar7);
        }
      }
      else {
        if (b->size != 0) {
          uVar7 = 0;
          do {
            if (uVar7 == 0) {
              setByte(this_00->lower_cache,uVar4,
                      *(b->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,cycles_00);
            }
            else {
              setByteCopy(this_00->lower_cache,uVar4 + (int)uVar7,
                          (b->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7],(uint32_t *)0x0);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < b->size);
          pCVar5 = this_00->lower_cache;
        }
        if (cycles_00 != (uint32_t *)0x0) {
          *cycles_00 = *cycles_00 + (pCVar5->policy).hit_latency;
        }
        uVar2 = (pCVar5->policy).hit_latency;
        uVar7 = (ulong)uVar2;
        puVar1 = &(this_00->statistics).cycle_cnt;
        *puVar1 = *puVar1 + uVar2;
      }
      return (uint8_t)uVar7;
    }
  }
  log2(__x);
  sVar3 = (extraout_AL < 0x21) * (' ' - extraout_AL);
  return *(uint8_t *)
          (*(long *)&(this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
                     _M_impl.super__Vector_impl_data._M_start[(int)uVar4].data.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + (ulong)((addr << sVar3) >> sVar3));
}

Assistant:

uint8_t Cache::getByteCopy(uint32_t addr, uint32_t *cycles) {
    int block_id;
    if ((block_id = this->getBlockId(addr)) != -1) {
        // in cache
        uint32_t offset = this->getOffset(addr);
        return this->blocks[block_id].data[offset];
    }
    this->loadBlockFromLowerLevel(addr, cycles);
    if ((block_id = this->getBlockId(addr)) != -1) {
        uint32_t offset = this->getOffset(addr);
        return this->blocks[block_id].data[offset];
    } else {
        fprintf(stderr, "Error, data should in top level cache, but it seems not\n");
        exit(-1);
    }
}